

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall RealCommandRunner::WaitForCommand(RealCommandRunner *this,Result *result)

{
  _Base_ptr p_Var1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *this_00;
  _Base_ptr p_Var4;
  iterator __position;
  
  while (this_00 = SubprocessSet::NextFinished(&this->subprocs_), this_00 == (Subprocess *)0x0) {
    bVar2 = SubprocessSet::DoWork(&this->subprocs_);
    if (bVar2) goto LAB_00109245;
  }
  EVar3 = Subprocess::Finish(this_00);
  result->status = EVar3;
  Subprocess::GetOutput_abi_cxx11_(this_00);
  std::__cxx11::string::_M_assign((string *)&result->output);
  __position._M_node = &(this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = __position._M_node;
  for (p_Var1 = (this->subproc_to_edge_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(Subprocess **)(p_Var1 + 1) < this_00])
  {
    if (*(Subprocess **)(p_Var1 + 1) >= this_00) {
      p_Var4 = p_Var1;
    }
  }
  if ((p_Var4 != __position._M_node) && (*(Subprocess **)(p_Var4 + 1) <= this_00)) {
    __position._M_node = p_Var4;
  }
  result->edge = (Edge *)__position._M_node[1]._M_parent;
  std::
  _Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
  ::erase_abi_cxx11_((_Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                      *)&this->subproc_to_edge_,__position);
  Subprocess::~Subprocess(this_00);
  operator_delete(this_00,0x30);
LAB_00109245:
  return this_00 != (Subprocess *)0x0;
}

Assistant:

bool RealCommandRunner::WaitForCommand(Result* result) {
  Subprocess* subproc;
  while ((subproc = subprocs_.NextFinished()) == NULL) {
    bool interrupted = subprocs_.DoWork();
    if (interrupted)
      return false;
  }

  result->status = subproc->Finish();
  result->output = subproc->GetOutput();

  map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.find(subproc);
  result->edge = e->second;
  subproc_to_edge_.erase(e);

  delete subproc;
  return true;
}